

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O0

void scp_source_send_CD(ScpSource *scp,char cmdchar,fxp_attrs attrs,uint64_t size,ptrlen name)

{
  int iVar1;
  uint uVar2;
  strbuf *psVar3;
  void *pvVar4;
  ptrlen pVar5;
  ScpSource *local_50;
  void *local_48;
  char *slash;
  strbuf *cmd;
  uint64_t size_local;
  char cmdchar_local;
  ScpSource *scp_local;
  ptrlen name_local;
  
  name_local.ptr = (void *)name.len;
  scp_local = (ScpSource *)name.ptr;
  if (scp->n_pending_commands != 0) {
    __assert_fail("scp->n_pending_commands == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/scpserver.c"
                  ,0x224,
                  "void scp_source_send_CD(ScpSource *, char, struct fxp_attrs, uint64_t, ptrlen)");
  }
  if (((scp->send_file_times & 1U) != 0) &&
     (((undefined1  [56])attrs & (undefined1  [56])0x8) != (undefined1  [56])0x0)) {
    psVar3 = strbuf_new();
    iVar1 = scp->n_pending_commands;
    scp->n_pending_commands = iVar1 + 1;
    scp->pending_commands[iVar1] = psVar3;
    BinarySink_put_fmt(psVar3->binarysink_,"T%lu 0 %lu 0\n",attrs.mtime,attrs.atime);
  }
  while (pvVar4 = memchr(scp_local,0x2f,(size_t)name_local.ptr), pvVar4 != (void *)0x0) {
    pVar5 = make_ptrlen((void *)((long)pvVar4 + 1),
                        (long)name_local.ptr - ((long)pvVar4 + (1 - (long)scp_local)));
    local_50 = (ScpSource *)pVar5.ptr;
    scp_local = local_50;
    local_48 = (void *)pVar5.len;
    name_local.ptr = local_48;
  }
  psVar3 = strbuf_new();
  iVar1 = scp->n_pending_commands;
  scp->n_pending_commands = iVar1 + 1;
  scp->pending_commands[iVar1] = psVar3;
  uVar2 = string_length_for_printf((size_t)name_local.ptr);
  BinarySink_put_fmt(psVar3->binarysink_,"%c%04o %lu %.*s\n",(ulong)(uint)(int)cmdchar,
                     (ulong)((uint)attrs.permissions & 0xfff),size,(ulong)uVar2,scp_local);
  if (cmdchar == 'C') {
    psVar3 = strbuf_new();
    iVar1 = scp->n_pending_commands;
    scp->n_pending_commands = iVar1 + 1;
    scp->pending_commands[iVar1] = psVar3;
  }
  return;
}

Assistant:

static void scp_source_send_CD(
    ScpSource *scp, char cmdchar,
    struct fxp_attrs attrs, uint64_t size, ptrlen name)
{
    strbuf *cmd;

    assert(scp->n_pending_commands == 0);

    if (scp->send_file_times && (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
        scp->pending_commands[scp->n_pending_commands++] = cmd = strbuf_new();
        /* Our SFTP-based filesystem API doesn't support microsecond times */
        put_fmt(cmd, "T%lu 0 %lu 0\012", attrs.mtime, attrs.atime);
    }

    const char *slash;
    while ((slash = memchr(name.ptr, '/', name.len)) != NULL)
        name = make_ptrlen(
            slash+1, name.len - (slash+1 - (const char *)name.ptr));

    scp->pending_commands[scp->n_pending_commands++] = cmd = strbuf_new();
    put_fmt(cmd, "%c%04o %"PRIu64" %.*s\012", cmdchar,
            (unsigned)(attrs.permissions & 07777),
            size, PTRLEN_PRINTF(name));

    if (cmdchar == 'C') {
        /* We'll also wait for an ack before sending the file data,
         * which we record by saving a zero-length 'command' to be
         * sent after the C. */
        scp->pending_commands[scp->n_pending_commands++] = cmd = strbuf_new();
    }
}